

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::Init(CInput *this)

{
  IKernel *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CConfig *pCVar3;
  undefined4 extraout_var_01;
  
  (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[0x10])();
  pIVar1 = (this->super_IEngineInput).super_IInput.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"enginegraphics");
  this->m_pGraphics = (IEngineGraphics *)CONCAT44(extraout_var,iVar2);
  pIVar1 = (this->super_IEngineInput).super_IInput.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  pCVar3 = (CConfig *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x30))
                     ((long *)CONCAT44(extraout_var_00,iVar2));
  this->m_pConfig = pCVar3;
  pIVar1 = (this->super_IEngineInput).super_IInput.super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"console");
  this->m_pConsole = (IConsole *)CONCAT44(extraout_var_01,iVar2);
  (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[9])(this);
  InitJoysticks(this);
  return;
}

Assistant:

void CInput::Init()
{
	StopTextInput();

	m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	MouseModeRelative();

	InitJoysticks();
}